

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

bool __thiscall
soplex::SPxFastRT<double>::maxShortLeave
          (SPxFastRT<double> *this,double *sel,int leave,double maxabs)

{
  element_type *this_00;
  UpdateVector<double> *this_01;
  double *pdVar1;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  Real RVar2;
  double dVar3;
  double shortval;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  SSVectorBase<double> *in_stack_ffffffffffffffa0;
  VectorBase<double> *this_02;
  undefined1 local_1;
  
  SPxRatioTester<double>::tolerances
            ((SPxRatioTester<double> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2b9606);
  RVar2 = Tolerances::scaleAccordingToEpsilon(this_00,1e-05);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b9626);
  this_01 = SPxSolverBase<double>::fVec(*(SPxSolverBase<double> **)(in_RDI + 8));
  UpdateVector<double>::delta(this_01);
  dVar3 = SSVectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  *in_RSI = dVar3;
  if (*in_RSI <= in_XMM0_Qa * RVar2) {
    if (-in_XMM0_Qa * RVar2 <= *in_RSI) {
      local_1 = false;
    }
    else {
      SPxSolverBase<double>::lbBound(*(SPxSolverBase<double> **)(in_RDI + 8));
      pdVar1 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c)
      ;
      this_02 = (VectorBase<double> *)*pdVar1;
      SPxSolverBase<double>::fVec(*(SPxSolverBase<double> **)(in_RDI + 8));
      pdVar1 = VectorBase<double>::operator[](this_02,in_stack_ffffffffffffff9c);
      *in_RSI = ((double)this_02 - *pdVar1) / *in_RSI;
      local_1 = true;
    }
  }
  else {
    SPxSolverBase<double>::ubBound(*(SPxSolverBase<double> **)(in_RDI + 8));
    pdVar1 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    dVar3 = *pdVar1;
    SPxSolverBase<double>::fVec(*(SPxSolverBase<double> **)(in_RDI + 8));
    pdVar1 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *in_RSI = (dVar3 - *pdVar1) / *in_RSI;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SPxFastRT<R>::maxShortLeave(R& sel, int leave, R maxabs)
{
   assert(leave >= 0);
   assert(maxabs >= 0);

   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   sel = this->thesolver->fVec().delta()[leave];

   if(sel > maxabs * shortval)
   {
      sel = (this->thesolver->ubBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   if(sel < -maxabs * shortval)
   {
      sel = (this->thesolver->lbBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   return false;
}